

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

Bool prvTidyTextNodeEndWithSpace(Lexer *lexer,Node *node)

{
  char cVar1;
  uint in_EAX;
  Bool BVar2;
  Bool BVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint c;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  BVar2 = prvTidynodeIsText(node);
  BVar3 = no;
  if (BVar2 != no) {
    uVar6 = node->start;
    uVar5 = node->end;
    if (uVar6 < uVar5) {
      uStack_28 = (ulong)(uint)uStack_28;
      do {
        cVar1 = lexer->lexbuf[uVar6];
        uStack_28 = (ulong)CONCAT14(cVar1,(uint)uStack_28);
        if (cVar1 < '\0') {
          uVar4 = prvTidyGetUTF8(lexer->lexbuf + uVar6,(uint *)((long)&uStack_28 + 4));
          uVar6 = uVar6 + uVar4;
          uVar5 = node->end;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
      BVar3 = (Bool)(uStack_28._4_4_ == 10 || uStack_28._4_4_ == 0x20);
    }
  }
  return BVar3;
}

Assistant:

Bool TY_(TextNodeEndWithSpace)( Lexer *lexer, Node *node )
{
    if (TY_(nodeIsText)(node) && node->end > node->start)
    {
        uint i, c = '\0'; /* initialised to avoid warnings */
        for (i = node->start; i < node->end; ++i)
        {
            c = (byte) lexer->lexbuf[i];
            if ( c > 0x7F )
                i += TY_(GetUTF8)( lexer->lexbuf + i, &c );
        }

        if ( c == ' ' || c == '\n' )
            return yes;
    }
    return no;
}